

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O1

int __thiscall
CVmObjFile::getp_set_charset(CVmObjFile *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_obj_id_t vVar2;
  
  if (getp_set_charset(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_set_charset();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&getp_set_charset::desc);
  if (iVar1 == 0) {
    vVar2 = get_charset_arg(0,1);
    *(vm_obj_id_t *)((this->super_CVmObject).ext_ + 0x10) = vVar2;
    sp_ = sp_ + -1;
    retval->typ = VM_NIL;
  }
  return 1;
}

Assistant:

int CVmObjFile::getp_set_charset(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                 uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* retrieve and save the character set argument */
    get_ext()->charset = get_charset_arg(vmg_ 0, 1);

    /* discard arguments */
    G_stk->discard();

    /* no return value */
    retval->set_nil();

    /* handled */
    return TRUE;
}